

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_resignation_request
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> *msg,ptr<resp_msg> *resp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  msg_base *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar6;
  int in_stack_000001f8;
  undefined1 in_stack_000001ff;
  raft_server *in_stack_00000200;
  raft_server *in_stack_ffffffffffffff48;
  shared_ptr<nuraft::resp_msg> *in_stack_ffffffffffffff50;
  shared_ptr<nuraft::resp_msg> local_78 [3];
  string local_48 [48];
  msg_base *local_18;
  
  local_18 = in_RDX;
  bVar1 = is_leader(in_stack_ffffffffffffff48);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1cc2bb);
      iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (3 < iVar2) {
        in_stack_ffffffffffffff48 =
             (raft_server *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cc2de);
        in_stack_ffffffffffffff50 = local_78;
        msg_if_given_abi_cxx11_
                  ((char *)in_stack_ffffffffffffff50,"[RESIGNATION REQUEST] got request");
        (*in_stack_ffffffffffffff48->_vptr_raft_server[8])
                  (in_stack_ffffffffffffff48,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_resignation_request",0xf3,in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    msg_base::get_src(local_18);
    yield_leadership(in_stack_00000200,(bool)in_stack_000001ff,in_stack_000001f8);
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<nuraft::resp_msg> *)in_stack_ffffffffffffff48);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1cc1d6);
      iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (1 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cc1f9);
        uVar3 = msg_base::get_src(local_18);
        msg_if_given_abi_cxx11_
                  ((char *)local_48,"got resignation request from peer %d, but I\'m not a leader",
                   (ulong)uVar3);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_resignation_request",0xf0,local_48);
        std::__cxx11::string::~string(local_48);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<nuraft::resp_msg> *)in_stack_ffffffffffffff48);
    _Var5._M_pi = extraout_RDX;
  }
  pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_resignation_request
                           ( req_msg& req,
                             ptr<custom_notification_msg> msg,
                             ptr<resp_msg> resp )
{
    if (!is_leader()) {
        p_er("got resignation request from peer %d, "
             "but I'm not a leader", req.get_src());
        return resp;
    }
    p_in("[RESIGNATION REQUEST] got request");

    yield_leadership(false, req.get_src());
    return resp;
}